

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O2

Code * __thiscall r_exec::PGMOverlay::dereference_in_ptr(PGMOverlay *this,Atom *a)

{
  Atom *pAVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  Code *pCVar6;
  undefined4 extraout_var;
  Atom ptr;
  undefined4 local_20;
  undefined4 local_1c;
  
  cVar2 = r_code::Atom::getDescriptor();
  if (cVar2 == -0x74) {
    pAVar1 = (this->super_InputLessPGMOverlay).super_Overlay.code;
    bVar3 = r_code::Atom::asRelativeIndex();
    local_20 = *(undefined4 *)(pAVar1 + (ulong)bVar3 * 4);
    local_1c = local_20;
    pCVar6 = dereference_in_ptr(this,(Atom *)&local_1c);
    r_code::Atom::~Atom((Atom *)&local_1c);
    uVar4 = r_code::Atom::asIndex();
    (*(pCVar6->super__Object)._vptr__Object[4])(pCVar6,(ulong)uVar4);
    uVar4 = r_code::Atom::asIndex();
    iVar5 = (*(pCVar6->super__Object)._vptr__Object[9])(pCVar6,(ulong)uVar4);
    pCVar6 = (Code *)CONCAT44(extraout_var,iVar5);
    r_code::Atom::~Atom((Atom *)&local_20);
  }
  else if (cVar2 == -0x78) {
    bVar3 = r_code::Atom::asInputIndex();
    pCVar6 = (Code *)(this->input_views).
                     super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[bVar3].object[2]._vptr__Object;
  }
  else {
    pCVar6 = (Code *)0x0;
  }
  return pCVar6;
}

Assistant:

Code *PGMOverlay::dereference_in_ptr(Atom a)
{
    switch (a.getDescriptor()) {
    case Atom::IN_OBJ_PTR:
        return getInputObject(a.asInputIndex());

    case Atom::D_IN_OBJ_PTR: {
        Atom ptr = code[a.asRelativeIndex()]; // must be either an IN_OBJ_PTR or a D_IN_OBJ_PTR.
        Code *parent = dereference_in_ptr(ptr);
        return parent->get_reference(parent->code(ptr.asIndex()).asIndex());
    }

    default: // shall never happen.
        return nullptr;
    }
}